

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>::erase
          (QHash<QFontDatabasePrivate::ExtendedScript,_QList<QString>_> *this,const_iterator it)

{
  ulong uVar1;
  uint uVar2;
  Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> *this_00;
  Span *pSVar3;
  long in_FS_OFFSET;
  iterator iVar4;
  Bucket bucket;
  iterator<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_> local_40;
  long local_30;
  
  uVar1 = it.i.bucket;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  detach(this);
  this_00 = this->d;
  pSVar3 = this_00->spans + (uVar1 >> 7);
  uVar2 = (uint)it.i.bucket & 0x7f;
  bucket.index._0_4_ = uVar2;
  bucket.span = pSVar3;
  bucket.index._4_4_ = 0;
  local_40.d = this_00;
  local_40.bucket = uVar1;
  QHashPrivate::Data<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::
  erase(this_00,bucket);
  if (((((long)pSVar3 - (long)this->d->spans) / 0x90 << 7 | (ulong)uVar2) == this->d->numBuckets - 1
      ) || (pSVar3->offsets[uVar2] == 0xff)) {
    QHashPrivate::
    iterator<QHashPrivate::Node<QFontDatabasePrivate::ExtendedScript,_QList<QString>_>_>::operator++
              (&local_40);
    uVar1 = local_40.bucket;
    this_00 = local_40.d;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    iVar4.i.bucket = uVar1;
    iVar4.i.d = this_00;
    return (iterator)iVar4.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(it != constEnd());
        detach();
        // ensure a valid iterator across the detach:
        iterator i = iterator{d->detachedIterator(it.i)};
        typename Data::Bucket bucket(i.i);

        d->erase(bucket);
        if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
            ++i;
        return i;
    }